

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_s2c_opening_serialize
              (secp256k1_context *ctx,uchar *output33,secp256k1_ecdsa_s2c_opening *opening)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  size_t out_len;
  size_t local_8;
  
  local_8 = 0x21;
  if (output33 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "output33 != NULL";
  }
  else {
    if (opening != (secp256k1_ecdsa_s2c_opening *)0x0) {
      iVar1 = secp256k1_ec_pubkey_serialize(ctx,output33,&local_8,(secp256k1_pubkey *)opening,0x102)
      ;
      return iVar1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "opening != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ecdsa_s2c_opening_serialize(const secp256k1_context* ctx, unsigned char* output33, const secp256k1_ecdsa_s2c_opening* opening) {
    size_t out_len = 33;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output33 != NULL);
    ARG_CHECK(opening != NULL);
    return secp256k1_ec_pubkey_serialize(ctx, output33, &out_len, (const secp256k1_pubkey*) opening, SECP256K1_EC_COMPRESSED);
}